

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpFixed<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined8 uVar1;
  char *pcVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  Nonnull<const_char_*> failure_msg;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar6;
  FieldEntry *entry;
  FieldEntry *pFVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  LogMessageFatal local_40;
  
  entry = (FieldEntry *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  pFVar7 = entry;
  if (((ulong)entry & 3) != 0) goto LAB_00210287;
  uVar8 = entry->type_card & 0x30;
  if (uVar8 == 0x20) {
    pcVar2 = MpRepeatedFixed<true>(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  uVar9 = entry->type_card & 0x1c0;
  uVar10 = data.field_0._0_4_ & 7;
  aVar6 = data.field_0;
  if ((ulong)uVar9 == 0xc0) {
    if (uVar10 != 1) {
LAB_0021019c:
      UNRECOVERED_JUMPTABLE = table->fallback;
      goto LAB_0021024a;
    }
  }
  else {
    if (uVar9 == 0x80) {
      failure_msg = (Nonnull<const_char_*>)0x0;
    }
    else {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              ((ulong)uVar9,0x80,
                               "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
    }
    if (failure_msg != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x77f,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    if (uVar10 != 5) goto LAB_0021019c;
  }
  if (uVar8 == 0x30) {
    ChangeOneof(table,entry,data.field_0._0_4_ >> 3,(ParseContext *)aVar6,msg);
  }
  else if (uVar8 == 0x10) {
    pFVar7 = (FieldEntry *)((long)&msg->_vptr_MessageLite + (ulong)((uint)entry->has_idx >> 5) * 4);
    if (((ulong)pFVar7 & 3) != 0) goto LAB_00210287;
    pFVar7->offset = pFVar7->offset | 1 << ((byte)entry->has_idx & 0x1f);
  }
  pvVar3 = MaybeGetSplitBase(msg,true,table);
  pFVar7 = (FieldEntry *)((ulong)entry->offset + (long)pvVar3);
  if (uVar9 == 0xc0) {
    if (((ulong)pFVar7 & 7) != 0) {
      AlignFail();
    }
    uVar1 = *(undefined8 *)ptr;
    pFVar7->offset = (int)uVar1;
    pFVar7->has_idx = (int)((ulong)uVar1 >> 0x20);
    lVar4 = 8;
  }
  else {
    if (((ulong)pFVar7 & 3) != 0) goto LAB_00210287;
    pFVar7->offset = *(uint32_t *)ptr;
    lVar4 = 4;
  }
  ptr = ptr + lVar4;
  if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar9 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar9 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar5 = (ulong)(uVar9 & 0xfffffff8);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2));
    UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar5);
LAB_0021024a:
    pcVar2 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  if ((ulong)table->has_bits_offset != 0) {
    pFVar7 = (FieldEntry *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)pFVar7 & 3) != 0) {
LAB_00210287:
      AlignFail(pFVar7);
    }
    pFVar7->offset = pFVar7->offset | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpFixed(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing (wiretype fallback is handled there):
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  // Check for mismatched wiretype:
  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint32_t decoded_wiretype = data.tag() & 7;
  if (rep == field_layout::kRep64Bits) {
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED64) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED32) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }
  // Set the field present:
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (card == field_layout::kFcOneof) {
    ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  // Copy the value:
  if (rep == field_layout::kRep64Bits) {
    RefAt<uint64_t>(base, entry.offset) = UnalignedLoad<uint64_t>(ptr);
    ptr += sizeof(uint64_t);
  } else {
    RefAt<uint32_t>(base, entry.offset) = UnalignedLoad<uint32_t>(ptr);
    ptr += sizeof(uint32_t);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}